

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcc.hpp
# Opt level: O0

void __thiscall cppjit::builder::gcc::gcc(gcc *this,string *kernel_name)

{
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  string *local_18;
  string *kernel_name_local;
  gcc *this_local;
  
  local_18 = kernel_name;
  kernel_name_local = (string *)this;
  builder::builder(&this->super_builder,kernel_name,false);
  (this->super_builder)._vptr_builder = (_func_int **)&PTR_compile_impl_0010cc70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->compiler,"g++",&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->linker,"g++",local_2d);
  std::allocator<char>::~allocator((allocator<char> *)local_2d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&this->cpp_flags,"-std=c++14 -fPIC -fno-gnu-unique",&local_2e);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->link_flags,"-shared -fno-gnu-unique",&local_2f);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->include_paths,"",&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->library_paths,"",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->libraries,"",&local_32);
  std::allocator<char>::~allocator((allocator<char> *)&local_32);
  return;
}

Assistant:

gcc(const std::string &kernel_name) : builder(kernel_name) {}